

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

void ot::commissioner::CommissionerApp::MergeDataset
               (CommissionerDataset *aDst,CommissionerDataset *aSrc)

{
  byte *pbVar1;
  
  if ((short)aSrc->mPresentFlags < 0) {
    aDst->mBorderAgentLocator = aSrc->mBorderAgentLocator;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    aDst->mSessionId = aSrc->mSessionId;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if ((aSrc->mPresentFlags & 0x2000) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xdf;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mSteeringData,&aSrc->mSteeringData);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if ((aSrc->mPresentFlags & 0x1000) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xef;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mAeSteeringData,&aSrc->mAeSteeringData);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if ((aSrc->mPresentFlags & 0x800) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNmkpSteeringData,&aSrc->mNmkpSteeringData);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((aSrc->mPresentFlags & 0x400) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  else {
    aDst->mJoinerUdpPort = aSrc->mJoinerUdpPort;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  if ((aSrc->mPresentFlags & 0x200) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  else {
    aDst->mAeUdpPort = aSrc->mAeUdpPort;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if ((aSrc->mPresentFlags & 0x100) == 0) {
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  else {
    aDst->mNmkpUdpPort = aSrc->mNmkpUdpPort;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(CommissionerDataset &aDst, const CommissionerDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                     \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)  \
    {                                                            \
        aDst.m##name = aSrc.m##name;                             \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(BorderAgentLocator);
    SET_IF_PRESENT(SessionId);

#undef SET_IF_PRESENT
#define SET_IF_PRESENT(name)                                      \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)   \
    {                                                             \
        aDst.m##name = aSrc.m##name;                              \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit;  \
    }                                                             \
    else                                                          \
    {                                                             \
        aDst.mPresentFlags &= ~CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(SteeringData);
    SET_IF_PRESENT(AeSteeringData);
    SET_IF_PRESENT(NmkpSteeringData);
    SET_IF_PRESENT(JoinerUdpPort);
    SET_IF_PRESENT(AeUdpPort);
    SET_IF_PRESENT(NmkpUdpPort);

#undef SET_IF_PRESENT
}